

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifoph(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDI;
  int n;
  int output_occurred;
  int hidden;
  runsdef val;
  char *in_stack_ffffffffffffffb8;
  int e;
  errcxdef *in_stack_ffffffffffffffc0;
  errcxdef *ctx_00;
  undefined8 in_stack_ffffffffffffffc8;
  dattyp dVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24 [3];
  undefined8 local_18;
  undefined8 *local_8;
  
  dVar3 = (dattyp)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = in_RDI;
  outstat(local_24,&local_28);
  if (*(char *)(*(long *)(local_8[1] + 0x20) + -0x10) == '\b') {
    *(long *)(local_8[1] + 0x20) = *(long *)(local_8[1] + 0x20) + -0x10;
    if (local_24[0] == 0) {
      local_18 = 0;
    }
    else if (local_28 == 0) {
      local_18 = 1;
    }
    else {
      local_18 = 2;
    }
    runpush((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),dVar3,
            (runsdef *)in_stack_ffffffffffffffc0);
    outhide();
  }
  else if (*(char *)(*(long *)(local_8[1] + 0x20) + -0x10) == '\x05') {
    *(long *)(local_8[1] + 0x20) = *(long *)(local_8[1] + 0x20) + -0x10;
    dVar3 = (dattyp)((ulong)local_8[1] >> 0x20);
    outshow();
    runpush((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),dVar3,
            (runsdef *)in_stack_ffffffffffffffc0);
  }
  else {
    if (*(char *)(*(long *)(local_8[1] + 0x20) + -0x10) != '\x01') {
      errsigf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    }
    lVar1 = *(long *)(local_8[1] + 0x20);
    *(long *)(local_8[1] + 0x20) = lVar1 + -0x10;
    e = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(**(long **)local_8[1] + 0x68) = 0;
      runsign((runcxdef *)in_stack_ffffffffffffffc0,e);
    }
    ctx_00 = *(errcxdef **)(*(long *)(local_8[1] + 0x20) + 8);
    iVar2 = (int)ctx_00;
    if (iVar2 == 0) {
      outshow();
      runpush((runcxdef *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),dVar3,(runsdef *)ctx_00);
    }
    else if (iVar2 == 1) {
      runpush((runcxdef *)CONCAT44(1,in_stack_ffffffffffffffd0),dVar3,(runsdef *)ctx_00);
    }
    else {
      if (iVar2 != 2) {
        *(char **)(*(long *)*local_8 + 0x18) = "outhide";
        *(undefined4 *)(*(long *)*local_8 + 0x68) = 1;
        errsign(ctx_00,e,(char *)0x13aac3);
      }
      runpush((runcxdef *)CONCAT44(2,in_stack_ffffffffffffffd0),dVar3,(runsdef *)ctx_00);
      outsethidden();
    }
  }
  return;
}

Assistant:

void bifoph(bifcxdef *ctx, int argc)
{
    runsdef val;
    int     hidden, output_occurred;

    bifcntargs(ctx, 1, argc);
    outstat(&hidden, &output_occurred);
    if (runtostyp(ctx->bifcxrun) == DAT_TRUE)
    {
        /* throw away the flag */
        rundisc(ctx->bifcxrun);
        
        /* figure out appropriate return value */
        if (!hidden)
            val.runsv.runsvnum = 0;
        else if (!output_occurred)
            val.runsv.runsvnum = 1;
        else
            val.runsv.runsvnum = 2;
        runpush(ctx->bifcxrun, DAT_NUMBER, &val);

        /* actually hide the output, resetting count flag */
        outhide();
    }
    else if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        /* throw away the flag */
        rundisc(ctx->bifcxrun);

        /* show output, returning status */
        runpush(ctx->bifcxrun, runclog(outshow()), &val);
    }
    else if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        int n = runpopnum(ctx->bifcxrun);

        if (n == 0)
        {
            /* output was not hidden - show output and return status */
            runpush(ctx->bifcxrun, runclog(outshow()), &val);
        }
        else if (n == 1)
        {
            /*
             *   Output was hidden, but no output had occurred yet.
             *   Leave output hidden and return whether any output has
             *   occurred.
             */
            runpush(ctx->bifcxrun, runclog(output_occurred), &val);
        }
        else if (n == 2)
        {
            /*
             *   Output was hidden, and output had already occurred.  If
             *   more output has occurred, return true, else return nil.
             *   In either case, set the output_occurred flag back to
             *   true, since it was true before the outhide(true).  
             */
            runpush(ctx->bifcxrun, runclog(output_occurred), &val);
            outsethidden();
        }
        else
            errsig1(ctx->bifcxerr, ERR_INVVBIF, ERRTSTR, "outhide");
    }
    else
        errsig(ctx->bifcxerr, ERR_REQNUM);
}